

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O0

void anon_unknown.dwarf_18f92a::readImage
               (char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *w,int *h,uint correctChecksum)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  Box2i *pBVar4;
  Rgba *pRVar5;
  ostream *poVar6;
  void *this;
  int *in_RCX;
  int *in_RDX;
  Array2D<Imf_2_5::Rgba> *in_RSI;
  uint in_R8D;
  int x;
  int y;
  uint checksum;
  int dy;
  int dx;
  Box2i *dw;
  RgbaInputFile in;
  undefined6 in_stack_ffffffffffffff00;
  unsigned_short in_stack_ffffffffffffff06;
  undefined8 in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff16;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  long in_stack_ffffffffffffff48;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffff50;
  int local_88;
  int local_84;
  uint local_80;
  
  Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            ((RgbaInputFile *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1e1e1a);
  *in_RDX = ((pBVar4->max).x - (pBVar4->min).x) + 1;
  *in_RCX = ((pBVar4->max).y - (pBVar4->min).y) + 1;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RSI,0);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            ((RgbaInputFile *)in._channelNamePrefix.field_2._M_allocated_capacity,
             (Rgba *)in._channelNamePrefix._M_string_length,in._channelNamePrefix._0_8_,
             (size_t)in._fromYca);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1e1f20);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1e1f40);
  Imf_2_5::RgbaInputFile::readPixels
            ((RgbaInputFile *)CONCAT26(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10),
             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08);
  local_80 = 0;
  for (local_84 = 0; local_84 < *in_RCX; local_84 = local_84 + 1) {
    for (local_88 = 0; local_88 < *in_RDX; local_88 = local_88 + 1) {
      pRVar5 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RSI,(long)local_84);
      uVar1 = half::bits(&pRVar5[local_88].r);
      pRVar5 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RSI,(long)local_84);
      uVar2 = half::bits(&pRVar5[local_88].g);
      pRVar5 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RSI,(long)local_84);
      uVar3 = half::bits(&pRVar5[local_88].b);
      pRVar5 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RSI,(long)local_84);
      in_stack_ffffffffffffff06 = half::bits(&pRVar5[local_88].a);
      local_80 = (uint)in_stack_ffffffffffffff06 ^ local_80 ^ uVar1 ^ (uint)uVar2 ^ (uint)uVar3;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"checksum = ");
  this = (void *)std::ostream::operator<<(poVar6,local_80);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  if (local_80 == in_R8D) {
    poVar6 = std::operator<<((ostream *)&std::cout,", ok");
    std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
    Imf_2_5::RgbaInputFile::~RgbaInputFile
              ((RgbaInputFile *)CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00));
    return;
  }
  __assert_fail("checksum == correctChecksum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testNativeFormat.cpp"
                ,0x5d,
                "void (anonymous namespace)::readImage(const char *, Array2D<Rgba> &, int &, int &, unsigned int)"
               );
}

Assistant:

void
readImage (const char fileName[],
           Array2D<Rgba>& pixels,
           int& w,
           int& h,
           unsigned int correctChecksum)
{
    RgbaInputFile in (fileName);

    const Box2i &dw = in.dataWindow();

    w = dw.max.x - dw.min.x + 1;
    h = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (h, w);
    in.setFrameBuffer (&pixels[0][0] - dx - dy * w, 1, w);
    in.readPixels (in.dataWindow().min.y, in.dataWindow().max.y);

    unsigned int checksum = 0;

    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x)
        {
            checksum ^= pixels[y][x].r.bits();
            checksum ^= pixels[y][x].g.bits();
            checksum ^= pixels[y][x].b.bits();
            checksum ^= pixels[y][x].a.bits();
        }

    cout << "checksum = " << checksum << flush;

    assert (checksum == correctChecksum);
    
    cout << ", ok" << flush;
}